

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O0

size_t __thiscall
avro::parsing::SimpleParser<avro::parsing::JsonHandler>::popSize
          (SimpleParser<avro::parsing::JsonHandler> *this)

{
  reference this_00;
  unsigned_long uVar1;
  size_t result;
  Symbol *s;
  
  this_00 = std::
            stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
            ::top((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
                   *)0x2a678c);
  Symbol::kind(this_00);
  assertMatch(sTerminalLow,0x2a67a7);
  uVar1 = Symbol::extra<unsigned_long>((Symbol *)0x2a67b1);
  std::
  stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
  ::pop((stack<avro::parsing::Symbol,_std::deque<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>
         *)0x2a67c4);
  return uVar1;
}

Assistant:

size_t popSize() {
        const Symbol& s = parsingStack.top();
        assertMatch(Symbol::sSizeCheck, s.kind());
        size_t result = s.extra<size_t>();
        parsingStack.pop();
        return result;
    }